

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

void __thiscall
BaseIndex::ChainStateFlushed(BaseIndex *this,ChainstateRole role,CBlockLocator *locator)

{
  uint256 *puVar1;
  CBlockIndex *this_00;
  CBlockIndex *pCVar2;
  CBlockIndex *pCVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  string local_68;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  undefined8 local_38;
  undefined8 local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((role != ASSUMEDVALID) && (((this->m_synced)._M_base._M_i & 1U) != 0)) {
    puVar1 = (locator->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
    criticalblock13.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    criticalblock13.super_unique_lock._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock13.super_unique_lock);
    pCVar2 = ::node::BlockManager::LookupBlockIndex(this->m_chainstate->m_blockman,puVar1);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
    if (pCVar2 == (CBlockIndex *)0x0) {
      base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock13,puVar1);
      FatalErrorf<char[18],std::__cxx11::string>
                (this,(ConstevalFormatString<2U>)0xf702ef,(char (*) [18])"ChainStateFlushed",
                 (string *)&criticalblock13);
    }
    else {
      this_00 = (this->m_best_block_index)._M_b._M_p;
      pCVar3 = CBlockIndex::GetAncestor(this_00,pCVar2->nHeight);
      if (pCVar3 == pCVar2) {
        Commit(this);
        goto LAB_0087d801;
      }
      base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock13,puVar1);
      puVar1 = this_00->phashBlock;
      if (puVar1 == (uint256 *)0x0) {
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_88 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
      uStack_80 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
      local_78 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
      uStack_70 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
      base_blob<256u>::ToString_abi_cxx11_(&local_68,&local_88);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
      ;
      source_file._M_len = 0x5e;
      logging_function._M_str = "ChainStateFlushed";
      logging_function._M_len = 0x11;
      LogPrintFormatInternal<char[18],std::__cxx11::string,std::__cxx11::string>
                (logging_function,source_file,0x16b,ALL,Info,(ConstevalFormatString<3U>)0xf70334,
                 (char (*) [18])"ChainStateFlushed",(string *)&criticalblock13,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    if (criticalblock13.super_unique_lock._M_device != (mutex_type *)&stack0xffffffffffffffc8) {
      operator_delete(criticalblock13.super_unique_lock._M_device,local_38 + 1);
    }
  }
LAB_0087d801:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BaseIndex::ChainStateFlushed(ChainstateRole role, const CBlockLocator& locator)
{
    // Ignore events from the assumed-valid chain; we will process its blocks
    // (sequentially) after it is fully verified by the background chainstate.
    if (role == ChainstateRole::ASSUMEDVALID) {
        return;
    }

    if (!m_synced) {
        return;
    }

    const uint256& locator_tip_hash = locator.vHave.front();
    const CBlockIndex* locator_tip_index;
    {
        LOCK(cs_main);
        locator_tip_index = m_chainstate->m_blockman.LookupBlockIndex(locator_tip_hash);
    }

    if (!locator_tip_index) {
        FatalErrorf("%s: First block (hash=%s) in locator was not found",
                   __func__, locator_tip_hash.ToString());
        return;
    }

    // This checks that ChainStateFlushed callbacks are received after BlockConnected. The check may fail
    // immediately after the sync thread catches up and sets m_synced. Consider the case where
    // there is a reorg and the blocks on the stale branch are in the ValidationInterface queue
    // backlog even after the sync thread has caught up to the new chain tip. In this unlikely
    // event, log a warning and let the queue clear.
    const CBlockIndex* best_block_index = m_best_block_index.load();
    if (best_block_index->GetAncestor(locator_tip_index->nHeight) != locator_tip_index) {
        LogPrintf("%s: WARNING: Locator contains block (hash=%s) not on known best "
                  "chain (tip=%s); not writing index locator\n",
                  __func__, locator_tip_hash.ToString(),
                  best_block_index->GetBlockHash().ToString());
        return;
    }

    // No need to handle errors in Commit. If it fails, the error will be already be logged. The
    // best way to recover is to continue, as index cannot be corrupted by a missed commit to disk
    // for an advanced index state.
    Commit();
}